

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

void __thiscall QFontDialogPrivate::updateStyles(QFontDialogPrivate *this)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  QFontDialog *pQVar7;
  QStringListModel *pQVar8;
  QStyle *pQVar9;
  QFontDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar10;
  int i;
  bool first;
  bool found;
  QFontDialog *q;
  QString cstyle;
  QStringList styles;
  QWidget *in_stack_fffffffffffffe58;
  QLineEdit *in_stack_fffffffffffffe60;
  QLineEdit *this_00;
  uint in_stack_fffffffffffffe68;
  undefined4 uVar11;
  int i_00;
  QWidget *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe84;
  QFontDialogPrivate *this_01;
  QLatin1StringView in_stack_fffffffffffffe88;
  QLatin1String *local_148;
  QLatin1String *local_118;
  QLatin1String *local_e8;
  int local_c8;
  undefined1 local_b0 [24];
  undefined1 local_98 [72];
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  this_01 = (QFontDialogPrivate *)in_stack_fffffffffffffe88.m_size;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = SUB84(in_RDI,0);
  i_00 = (int)((ulong)in_RDI >> 0x20);
  pQVar7 = q_func(in_RDI);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QFontListView::currentText((QFontListView *)CONCAT44(i_00,uVar11));
  QFontDatabase::styles((QString *)&local_20);
  QString::~QString((QString *)0x795aa9);
  pQVar8 = QFontListView::model((QFontListView *)0x795aba);
  QStringListModel::setStringList((QList_conflict2 *)pQVar8);
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x795ad7);
  if (bVar1) {
    QLineEdit::clear(in_stack_fffffffffffffe60);
    *(undefined1 *)(CONCAT44(i_00,uVar11) + 0x3cc) = 0;
    goto LAB_0079608a;
  }
  bVar1 = QString::isEmpty((QString *)0x795b10);
  if (!bVar1) {
    bVar1 = false;
    bVar3 = true;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)in_stack_fffffffffffffe60,(QString *)in_stack_fffffffffffffe58);
    do {
      this_01 = (QFontDialogPrivate *)in_stack_fffffffffffffe88.m_size;
      local_c8 = 0;
      while (iVar6 = local_c8, iVar5 = QFontListView::count((QFontListView *)CONCAT44(i_00,uVar11)),
            iVar6 < iVar5) {
        QFontListView::text((QFontListView *)in_stack_fffffffffffffe78,i_00);
        bVar2 = ::operator==((QString *)in_stack_fffffffffffffe60,
                             (QString *)in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe68 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe68);
        QString::~QString((QString *)0x795be9);
        if ((in_stack_fffffffffffffe68 & 0x1000000) != 0) {
          QFontListView::setCurrentItem((QFontListView *)this_01,in_stack_fffffffffffffe84);
          bVar1 = true;
          break;
        }
        local_c8 = local_c8 + 1;
      }
      if ((bVar1) || (!bVar3)) goto LAB_00795f3b;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT44(iVar6,in_stack_fffffffffffffe68),(size_t)in_stack_fffffffffffffe60
                );
      QVar10.m_size._4_4_ = i_00;
      QVar10.m_size._0_4_ = uVar11;
      QVar10.m_data = (char *)in_stack_fffffffffffffe78;
      bVar3 = QString::contains((QString *)in_stack_fffffffffffffe58,QVar10,CaseInsensitive);
      if (bVar3) {
        QVar10 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)CONCAT44(iVar6,in_stack_fffffffffffffe68),
                            (size_t)in_stack_fffffffffffffe60);
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT44(iVar6,in_stack_fffffffffffffe68),
                   (size_t)in_stack_fffffffffffffe60);
        local_e8 = (QLatin1String *)QVar10.m_size;
        QString::replace((QLatin1String *)&local_50,local_e8,(CaseSensitivity)QVar10.m_data);
        bVar3 = false;
      }
      else {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT44(iVar6,in_stack_fffffffffffffe68),
                   (size_t)in_stack_fffffffffffffe60);
        s.m_size._4_4_ = i_00;
        s.m_size._0_4_ = uVar11;
        s.m_data = (char *)in_stack_fffffffffffffe78;
        bVar3 = QString::contains((QString *)in_stack_fffffffffffffe58,s,CaseInsensitive);
        if (bVar3) {
          QVar10 = Qt::Literals::StringLiterals::operator____L1
                             ((char *)CONCAT44(iVar6,in_stack_fffffffffffffe68),
                              (size_t)in_stack_fffffffffffffe60);
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT44(iVar6,in_stack_fffffffffffffe68),
                     (size_t)in_stack_fffffffffffffe60);
          local_118 = (QLatin1String *)QVar10.m_size;
          QString::replace((QLatin1String *)&local_50,local_118,(CaseSensitivity)QVar10.m_data);
          bVar3 = false;
        }
        else {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT44(iVar6,in_stack_fffffffffffffe68),
                     (size_t)in_stack_fffffffffffffe60);
          s_00.m_size._4_4_ = i_00;
          s_00.m_size._0_4_ = uVar11;
          s_00.m_data = (char *)in_stack_fffffffffffffe78;
          bVar3 = QString::contains((QString *)in_stack_fffffffffffffe58,s_00,CaseInsensitive);
          if (bVar3) {
            QVar10 = Qt::Literals::StringLiterals::operator____L1
                               ((char *)CONCAT44(iVar6,in_stack_fffffffffffffe68),
                                (size_t)in_stack_fffffffffffffe60);
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT44(iVar6,in_stack_fffffffffffffe68),
                       (size_t)in_stack_fffffffffffffe60);
            local_148 = (QLatin1String *)QVar10.m_size;
            QString::replace((QLatin1String *)&local_50,local_148,(CaseSensitivity)QVar10.m_data);
            bVar3 = false;
          }
          else {
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT44(iVar6,in_stack_fffffffffffffe68),
                       (size_t)in_stack_fffffffffffffe60);
            s_01.m_size._4_4_ = i_00;
            s_01.m_size._0_4_ = uVar11;
            s_01.m_data = (char *)in_stack_fffffffffffffe78;
            bVar3 = QString::contains((QString *)in_stack_fffffffffffffe58,s_01,CaseInsensitive);
            if (!bVar3) goto LAB_00795f3b;
            in_stack_fffffffffffffe88 =
                 Qt::Literals::StringLiterals::operator____L1
                           ((char *)CONCAT44(iVar6,in_stack_fffffffffffffe68),
                            (size_t)in_stack_fffffffffffffe60);
            QVar10 = Qt::Literals::StringLiterals::operator____L1
                               ((char *)CONCAT44(iVar6,in_stack_fffffffffffffe68),
                                (size_t)in_stack_fffffffffffffe60);
            in_stack_fffffffffffffe78 = (QWidget *)QVar10.m_size;
            in_stack_fffffffffffffe84 = QVar10.m_data._4_4_;
            QString::replace((QLatin1String *)&local_50,
                             (QLatin1String *)in_stack_fffffffffffffe88.m_size,
                             (CaseSensitivity)in_stack_fffffffffffffe88.m_data);
            bVar3 = false;
          }
        }
      }
    } while( true );
  }
  QFontListView::setCurrentItem((QFontListView *)this_01,in_stack_fffffffffffffe84);
  goto LAB_00795f7a;
LAB_00795f3b:
  if (!bVar1) {
    QFontListView::setCurrentItem((QFontListView *)this_01,in_stack_fffffffffffffe84);
  }
  QString::~QString((QString *)0x795f65);
LAB_00795f7a:
  this_00 = *(QLineEdit **)(CONCAT44(i_00,uVar11) + 0x300);
  QFontListView::currentText((QFontListView *)CONCAT44(i_00,uVar11));
  QLineEdit::setText(this_00,(QString *)in_stack_fffffffffffffe58);
  QString::~QString((QString *)0x795fbe);
  pQVar9 = QWidget::style(in_stack_fffffffffffffe58);
  iVar6 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0xd,0,pQVar7);
  if ((iVar6 != 0) && (bVar1 = QWidget::hasFocus(in_stack_fffffffffffffe78), bVar1)) {
    QLineEdit::selectAll(this_00);
  }
  QFontListView::currentText((QFontListView *)CONCAT44(i_00,uVar11));
  QFontListView::currentText((QFontListView *)CONCAT44(i_00,uVar11));
  bVar4 = QFontDatabase::isSmoothlyScalable((QString *)local_98,(QString *)local_b0);
  *(byte *)(CONCAT44(i_00,uVar11) + 0x3cc) = bVar4 & 1;
  QString::~QString((QString *)0x79607d);
  QString::~QString((QString *)0x79608a);
LAB_0079608a:
  updateSizes(this_01);
  QList<QString>::~QList((QList<QString> *)0x7960a1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontDialogPrivate::updateStyles()
{
    Q_Q(QFontDialog);
    QStringList styles = QFontDatabase::styles(familyList->currentText());
    styleList->model()->setStringList(styles);

    if (styles.isEmpty()) {
        styleEdit->clear();
        smoothScalable = false;
    } else {
        if (!style.isEmpty()) {
            bool found = false;
            bool first = true;
            QString cstyle = style;

        redo:
            for (int i = 0; i < static_cast<int>(styleList->count()); i++) {
                if (cstyle == styleList->text(i)) {
                     styleList->setCurrentItem(i);
                     found = true;
                     break;
                 }
            }
            if (!found && first) {
                if (cstyle.contains("Italic"_L1)) {
                    cstyle.replace("Italic"_L1, "Oblique"_L1);
                    first = false;
                    goto redo;
                } else if (cstyle.contains("Oblique"_L1)) {
                    cstyle.replace("Oblique"_L1, "Italic"_L1);
                    first = false;
                    goto redo;
                } else if (cstyle.contains("Regular"_L1)) {
                    cstyle.replace("Regular"_L1, "Normal"_L1);
                    first = false;
                    goto redo;
                } else if (cstyle.contains("Normal"_L1)) {
                    cstyle.replace("Normal"_L1, "Regular"_L1);
                    first = false;
                    goto redo;
                }
            }
            if (!found)
                styleList->setCurrentItem(0);
        } else {
            styleList->setCurrentItem(0);
        }

        styleEdit->setText(styleList->currentText());
        if (q->style()->styleHint(QStyle::SH_FontDialog_SelectAssociatedText, nullptr, q)
                && styleList->hasFocus())
            styleEdit->selectAll();

        smoothScalable = QFontDatabase::isSmoothlyScalable(familyList->currentText(), styleList->currentText());
    }

    updateSizes();
}